

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::get_curv_edge_vert_flips
          (Omega_h *this,Mesh *mesh,Adj *curv_verts2edges,LOs *edge2curv_edge)

{
  LO LVar1;
  void *extraout_RDX;
  Read<signed_char> RVar2;
  Write<signed_char> local_120;
  undefined1 local_110 [8];
  type f;
  LO ncurv_verts;
  undefined1 local_98 [8];
  Write<signed_char> out;
  Read<int> local_78;
  Adj local_68;
  undefined1 local_38 [8];
  Read<signed_char> in;
  LOs *edge2curv_edge_local;
  Adj *curv_verts2edges_local;
  Mesh *mesh_local;
  
  in.write_.shared_alloc_.direct_ptr = edge2curv_edge;
  Adj::Adj(&local_68,curv_verts2edges);
  Read<int>::Read(&local_78,edge2curv_edge);
  get_curv_vert_edge_flips((Omega_h *)local_38,&local_68,&local_78);
  Read<int>::~Read(&local_78);
  Adj::~Adj(&local_68);
  LVar1 = Mesh::nedges(mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&ncurv_verts,"",
             (allocator *)((long)&f.in.write_.shared_alloc_.direct_ptr + 7));
  Write<signed_char>::Write((Write<signed_char> *)local_98,LVar1 * 2,'\0',(string *)&ncurv_verts);
  std::__cxx11::string::~string((string *)&ncurv_verts);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.in.write_.shared_alloc_.direct_ptr + 7));
  f.in.write_.shared_alloc_.direct_ptr._0_4_ = Graph::nnodes(&curv_verts2edges->super_Graph);
  Adj::Adj((Adj *)local_110,curv_verts2edges);
  Write<signed_char>::Write
            ((Write<signed_char> *)&f.curv_verts2edges.codes.write_.shared_alloc_.direct_ptr,
             (Write<signed_char> *)local_98);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.out.shared_alloc_.direct_ptr,(Read<signed_char> *)local_38);
  parallel_for<Omega_h::get_curv_edge_vert_flips(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::__0>
            ((LO)f.in.write_.shared_alloc_.direct_ptr,(type *)local_110,"get_curv_edge_vert_flips");
  Write<signed_char>::Write(&local_120,(Write<signed_char> *)local_98);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_120);
  Write<signed_char>::~Write(&local_120);
  get_curv_edge_vert_flips(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)local_110);
  Write<signed_char>::~Write((Write<signed_char> *)local_98);
  Read<signed_char>::~Read((Read<signed_char> *)local_38);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<I8> get_curv_edge_vert_flips(
    Mesh* mesh, Adj curv_verts2edges, LOs edge2curv_edge) {
  auto in = get_curv_vert_edge_flips(curv_verts2edges, edge2curv_edge);
  auto out = Write<I8>(mesh->nedges() * 2, I8(0));
  auto ncurv_verts = curv_verts2edges.nnodes();
  auto f = OMEGA_H_LAMBDA(LO curv_vert) {
    for (auto ve = curv_verts2edges.a2ab[curv_vert];
         ve < curv_verts2edges.a2ab[curv_vert + 1]; ++ve) {
      auto e = curv_verts2edges.ab2b[ve];
      auto code = curv_verts2edges.codes[ve];
      auto eev = code_which_down(code);
      out[e * 2 + eev] = in[ve];
    }
  };
  parallel_for(ncurv_verts, f, "get_curv_edge_vert_flips");
  return out;
}